

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleTorus.h
# Opt level: O1

void __thiscall
pzgeom::TPZTriangleTorus::Write(TPZTriangleTorus *this,TPZStream *buf,int withclassid)

{
  TPZGeoTriangle::Write(&this->super_TPZGeoTriangle,buf,withclassid);
  (*buf->_vptr_TPZStream[8])(buf,&this->fR,1);
  (*buf->_vptr_TPZStream[8])(buf,&this->fr,1);
  TPZFMatrix<double>::Write(&(this->fPhiTheta).super_TPZFMatrix<double>,buf,0);
  (*buf->_vptr_TPZStream[8])(buf,(this->fPhiTheta).fBuf,0xd);
  return;
}

Assistant:

void Write(TPZStream &buf, int withclassid) const override
        {
            pzgeom::TPZGeoTriangle::Write(buf, withclassid);
            buf.Write(&fR);
            buf.Write(&fr);
            fPhiTheta.Write(buf, 0);
		}